

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  SNMP_ERROR_RESPONSE SVar2;
  SortableOIDType *this;
  size_t sVar3;
  _func_int **pp_Var4;
  ssize_t sVar5;
  uint uVar6;
  char *__s;
  int responseLength;
  int len;
  char buf [29];
  sockaddr_in cliaddr;
  char buffer [1024];
  uint local_4b4;
  int local_4b0;
  socklen_t local_4ac;
  string local_4a8;
  _func_int **local_480;
  sockaddr local_478;
  string local_468;
  sockaddr local_448;
  string local_438 [32];
  
  local_4b0 = socket(2,2,0);
  if (local_4b0 < 0) {
    __s = "socket creation failed";
  }
  else {
    local_448.sa_data[6] = '\0';
    local_448.sa_data[7] = '\0';
    local_448.sa_data[8] = '\0';
    local_448.sa_data[9] = '\0';
    local_448.sa_data[10] = '\0';
    local_448.sa_data[0xb] = '\0';
    local_448.sa_data[0xc] = '\0';
    local_448.sa_data[0xd] = '\0';
    local_478.sa_family = 0;
    local_478.sa_data[0] = '\0';
    local_478.sa_data[1] = '\0';
    local_478.sa_data[2] = '\0';
    local_478.sa_data[3] = '\0';
    local_478.sa_data[4] = '\0';
    local_478.sa_data[5] = '\0';
    local_478.sa_data[6] = '\0';
    local_478.sa_data[7] = '\0';
    local_478.sa_data[8] = '\0';
    local_478.sa_data[9] = '\0';
    local_478.sa_data[10] = '\0';
    local_478.sa_data[0xb] = '\0';
    local_478.sa_data[0xc] = '\0';
    local_478.sa_data[0xd] = '\0';
    local_448.sa_family = 2;
    local_448.sa_data[0] = '\0';
    local_448.sa_data[1] = -0x5f;
    local_448.sa_data[2] = '\0';
    local_448.sa_data[3] = '\0';
    local_448.sa_data[4] = '\0';
    local_448.sa_data[5] = '\0';
    iVar1 = bind(local_4b0,&local_448,0x10);
    if (-1 < iVar1) {
      local_4ac = 0x10;
      puts("creating objs");
      uVar6 = 30000;
      local_480 = (_func_int **)&PTR_buildTypeWithValue_00115a38;
      do {
        uVar6 = uVar6 - 1;
        local_4a8.field_2._M_allocated_capacity._0_5_ = 0;
        local_4a8.field_2._5_8_ = 0;
        local_4a8._M_dataplus._M_p = (pointer)0x0;
        local_4a8._M_string_length._0_5_ = 0;
        local_4a8._M_string_length._5_3_ = 0;
        sprintf((char *)&local_4a8,"%s%d",".1.3.6.1.4.1.5.",(ulong)uVar6);
        this = (SortableOIDType *)operator_new(0x68);
        local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
        sVar3 = strlen((char *)&local_4a8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,&local_4a8,(long)&local_4a8._M_dataplus._M_p + sVar3);
        SortableOIDType::SortableOIDType(this,local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p);
        }
        pp_Var4 = (_func_int **)calloc(1,4);
        iVar1 = rand();
        *(int *)pp_Var4 = iVar1;
        local_438[0]._M_dataplus._M_p = (pointer)operator_new(0x28);
        ((ValueCallback *)local_438[0]._M_dataplus._M_p)->OID = this;
        ((ValueCallback *)local_438[0]._M_dataplus._M_p)->type = INTEGER;
        ((ValueCallback *)local_438[0]._M_dataplus._M_p)->isSettable = false;
        ((ValueCallback *)local_438[0]._M_dataplus._M_p)->setOccurred = false;
        ((ValueCallback *)local_438[0]._M_dataplus._M_p)->_vptr_ValueCallback = local_480;
        ((ValueCallback *)((long)local_438[0]._M_dataplus._M_p + 0x18))->_vptr_ValueCallback =
             pp_Var4;
        *(undefined4 *)&((ValueCallback *)((long)local_438[0]._M_dataplus._M_p + 0x18))->OID = 0;
        if (callbacks.super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            callbacks.super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<ValueCallback*,std::allocator<ValueCallback*>>::
          _M_push_back_aux<ValueCallback*>
                    ((deque<ValueCallback*,std::allocator<ValueCallback*>> *)&callbacks,
                     (ValueCallback **)local_438);
        }
        else {
          *callbacks.super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur = (ValueCallback *)local_438[0]._M_dataplus._M_p;
          callbacks.super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur =
               callbacks.super__Deque_base<ValueCallback_*,_std::allocator<ValueCallback_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      } while (1 < uVar6);
      puts("sorting");
      sort_handlers(&callbacks);
      puts("ready");
      do {
        sVar5 = recvfrom(local_4b0,local_438,0x400,0x100,&local_478,&local_4ac);
        *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + (long)(int)sVar5) = 0;
        local_4b4 = 0;
        local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"public","");
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"pub","");
        SVar2 = handlePacket((uint8_t *)local_438,(int)sVar5,(int *)&local_4b4,0x400,&callbacks,
                             &local_4a8,&local_468,(informCB)0x0,(void *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p);
        }
        printf("SNMP Packet : %d, len:%d\n",(ulong)(uint)SVar2,(ulong)local_4b4);
        if (SNMP_NO_PACKET < SVar2) {
          sendto(local_4b0,local_438,(long)(int)local_4b4,0,&local_478,local_4ac);
        }
      } while( true );
    }
    __s = "bind failed";
  }
  perror(__s);
  exit(1);
}

Assistant:

int main() { 
    int sockfd; 
    char buffer[MAXLINE]; 
    struct sockaddr_in servaddr, cliaddr; 
      
    // Creating socket file descriptor 
    if ( (sockfd = socket(AF_INET, SOCK_DGRAM, 0)) < 0 ) { 
        perror("socket creation failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    memset(&servaddr, 0, sizeof(servaddr)); 
    memset(&cliaddr, 0, sizeof(cliaddr)); 
      
    // Filling server information 
    servaddr.sin_family    = AF_INET; // IPv4 
    servaddr.sin_addr.s_addr = INADDR_ANY; 
    servaddr.sin_port = htons(PORT); 
      
    // Bind the socket with the server address 
    if ( bind(sockfd, (const struct sockaddr *)&servaddr,  
            sizeof(servaddr)) < 0 ) 
    { 
        perror("bind failed"); 
        exit(EXIT_FAILURE); 
    } 
      
    int len, n; 
  
    len = sizeof(cliaddr);  //len is value/resuslt 

    // IntegerCallback* intCallback = new IntegerCallback(new OIDType(".1.3.6.1.4.1.5.0"));
    // intCallback->value = &testingInt;
    // callbacks.push_back(intCallback);

    const char* prefix = ".1.3.6.1.4.1.5.";

    printf("creating objs\n");


    for(int i = 29999; i > 0; i--){
        char buf[29] = {0};
        sprintf(buf, "%s%d", prefix, i);
        auto* oid = new SortableOIDType(buf);

        int* testInt = (int*)calloc(1, sizeof(int));
        *testInt = rand();
        IntegerCallback* cb = new IntegerCallback(oid, testInt);
        callbacks.push_back(cb);
    }

    printf("sorting\n");

    sort_handlers(callbacks);

    printf("ready\n");

    while(true){
        n = recvfrom(sockfd, (char *)buffer, MAXLINE,  
                    MSG_WAITALL, ( struct sockaddr *) &cliaddr, 
                    (socklen_t*)&len); 
        buffer[n] = '\0'; 

        int responseLength = 0;

        SNMP_ERROR_RESPONSE response = handlePacket((uint8_t*)buffer, n, &responseLength, 1024, callbacks, "public", "pub");

        printf("SNMP Packet : %d, len:%d\n", response, responseLength); 
        if(response > 0){
            sendto(sockfd, (const char *)buffer, responseLength,  
            0, (const struct sockaddr *) &cliaddr, 
                len);
        }
        
    }
    return 0; 
}